

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
                   (TestResult *result)

{
  int iVar1;
  TestProperty *__s;
  allocator<char> *__a;
  string *in_RDI;
  TestProperty *property;
  int i;
  Message attributes;
  string *in_stack_ffffffffffffff18;
  Message *in_stack_ffffffffffffff20;
  Message *in_stack_ffffffffffffff28;
  TestResult *in_stack_ffffffffffffff30;
  Message *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  int iVar2;
  undefined8 local_81;
  string local_60 [32];
  char *local_40;
  TestProperty *local_28;
  int local_1c;
  
  Message::Message(in_stack_ffffffffffffff50);
  local_1c = 0;
  while( true ) {
    iVar2 = local_1c;
    iVar1 = TestResult::test_property_count((TestResult *)0x123f44);
    if (iVar1 <= iVar2) break;
    __s = TestResult::GetTestProperty
                    (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    local_28 = __s;
    __a = (allocator<char> *)
          Message::operator<<(in_stack_ffffffffffffff20,(char (*) [2])in_stack_ffffffffffffff18);
    local_40 = TestProperty::key((TestProperty *)0x123fa2);
    Message::operator<<(in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff18);
    Message::operator<<(in_stack_ffffffffffffff20,(char (*) [2])in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff30 =
         (TestResult *)
         Message::operator<<(in_stack_ffffffffffffff20,(char (*) [2])in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff28 = (Message *)TestProperty::value((TestProperty *)0x12400c);
    in_stack_ffffffffffffff20 = (Message *)&local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff60),(char *)__s,__a);
    EscapeXmlAttribute(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff18 =
         (string *)Message::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    Message::operator<<(in_stack_ffffffffffffff20,(char (*) [2])in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)((long)&local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_1c = local_1c + 1;
  }
  Message::GetString_abi_cxx11_(in_stack_ffffffffffffff28);
  Message::~Message((Message *)0x12414a);
  return in_RDI;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}